

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<char>::emplaceRealloc<char_const&>
          (SmallVectorBase<char> *this,pointer pos,char *args)

{
  ulong uVar1;
  pointer __src;
  size_t __n;
  pointer __dest;
  ptrdiff_t _Num;
  long lVar2;
  ulong n;
  
  if (this->len != 0x7fffffffffffffff) {
    n = this->len + 1;
    uVar1 = this->cap;
    if (n < uVar1 * 2) {
      n = uVar1 * 2;
    }
    if (0x7fffffffffffffff - uVar1 < uVar1) {
      n = 0x7fffffffffffffff;
    }
    lVar2 = (long)pos - (long)this->data_;
    __dest = (pointer)operator_new(n);
    __dest[lVar2] = *args;
    __src = this->data_;
    __n = this->len;
    if (__src + (__n - (long)pos) == (pointer)0x0) {
      if (__n != 0) {
        memmove(__dest,__src,__n);
      }
    }
    else {
      if (__src != pos) {
        memmove(__dest,__src,(long)pos - (long)__src);
      }
      memcpy(__dest + lVar2 + 1,pos,(size_t)(__src + (__n - (long)pos)));
    }
    if (__src != this->firstElement) {
      operator_delete(__src);
    }
    this->len = this->len + 1;
    this->cap = n;
    this->data_ = __dest;
    return __dest + lVar2;
  }
  detail::throwLengthError();
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}